

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void writeBPMatrix(Manager *manager,int puzNum,int rowNum,int colNum)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  reference this;
  reference pvVar4;
  int local_23c;
  int local_238;
  int j;
  int i;
  int local_224;
  ostream local_220 [4];
  int vec;
  ofstream file;
  int colNum_local;
  int rowNum_local;
  int puzNum_local;
  Manager *manager_local;
  
  std::ofstream::ofstream(local_220,"bpgMatrix.txt",0x10);
  local_224 = 0;
  while( true ) {
    sVar1 = std::vector<Board,_std::allocator<Board>_>::size(&manager->puzzles);
    if (sVar1 <= (ulong)(long)local_224) break;
    poVar2 = (ostream *)std::ostream::operator<<(local_220,puzNum);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)std::ostream::operator<<(local_220,rowNum);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,colNum);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_238 = 0; local_238 < rowNum; local_238 = local_238 + 1) {
      for (local_23c = 0; local_23c < colNum; local_23c = local_23c + 1) {
        pvVar3 = std::vector<Board,_std::allocator<Board>_>::operator[]
                           (&manager->puzzles,(long)local_224);
        this = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&pvVar3->matrix,(long)local_238);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this,(long)local_23c);
        poVar2 = std::operator<<(local_220,(string *)pvVar4);
        std::operator<<(poVar2,"  ");
      }
      std::operator<<(local_220,"\n");
    }
    std::operator<<(local_220,"\n\n\n");
    local_224 = local_224 + 1;
  }
  std::ofstream::close();
  poVar2 = std::operator<<((ostream *)&std::cout,"File saved sucessfully! ;)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void writeBPMatrix( Manager manager, int puzNum, int rowNum, int colNum )
{
	std::ofstream file("bpgMatrix.txt");
	
    for( int vec = 0; vec < manager.puzzles.size(); vec++ )
    {
	      file << puzNum << std::endl;

	      file << rowNum
		    << " "
		    << colNum
		    << std::endl;
        for ( int i = 0; i < rowNum; i++)
        {
		        for( int j = 0; j < colNum; j++ )
            {
                file << manager.puzzles[vec].matrix[i][j] << "  ";
            }

            file << "\n";
        }

        file << "\n\n\n";
    }

	file.close();

	std::cout << "File saved sucessfully! ;)" << std::endl;
}